

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_data_transfer.c
# Opt level: O0

void block_data_transfer(arm7tdmi_t *state,arminstr_t *arminstr)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint *in_RSI;
  long in_RDI;
  uint32_t value_5;
  uint rt_1;
  _Bool first;
  uint rt;
  access_type_t access;
  int after_inc;
  int before_inc;
  uint8_t original_mode;
  _Bool w;
  _Bool p;
  int num_registers;
  uint32_t new_base;
  uint32_t base;
  uint32_t address;
  block_data_transfer_t *instr;
  uint32_t value_6;
  uint32_t value_4;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  uint32_t in_stack_fffffffffffffd1c;
  arm7tdmi_t *in_stack_fffffffffffffd20;
  uint local_28c;
  uint local_1f0;
  uint local_1ec;
  uint local_1e4;
  undefined4 local_1e0;
  int local_1dc;
  int local_1d8;
  byte local_1d2;
  byte local_1d1;
  uint local_1cc;
  uint local_1c4;
  uint local_1a8;
  uint local_158;
  uint local_10c;
  uint local_bc;
  uint local_ac;
  uint local_60;
  
  uVar4 = *in_RSI >> 0x10 & 0xf;
  if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
    local_158 = *(uint *)(in_RDI + 0x6c + (ulong)(uVar4 - 8) * 4);
  }
  else if (uVar4 < 0xd) {
    local_158 = *(uint *)(in_RDI + 0x38 + (ulong)uVar4 * 4);
  }
  else if (uVar4 == 0xd) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_10c = *(uint *)(in_RDI + 0x84);
      break;
    case 0x12:
      local_10c = *(uint *)(in_RDI + 0x90);
      break;
    case 0x13:
      local_10c = *(uint *)(in_RDI + 0x88);
      break;
    default:
      local_10c = *(uint *)(in_RDI + 0x80);
      break;
    case 0x17:
      local_10c = *(uint *)(in_RDI + 0x8c);
      break;
    case 0x1b:
      local_10c = *(uint *)(in_RDI + 0x94);
    }
    local_158 = local_10c;
  }
  else if (uVar4 == 0xe) {
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_ac = *(uint *)(in_RDI + 0x9c);
      break;
    case 0x12:
      local_ac = *(uint *)(in_RDI + 0xa8);
      break;
    case 0x13:
      local_ac = *(uint *)(in_RDI + 0xa0);
      break;
    default:
      local_ac = *(uint *)(in_RDI + 0x98);
      break;
    case 0x17:
      local_ac = *(uint *)(in_RDI + 0xa4);
      break;
    case 0x1b:
      local_ac = *(uint *)(in_RDI + 0xac);
    }
    local_158 = local_ac;
  }
  else {
    if (uVar4 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
      exit(1);
    }
    local_158 = *(uint *)(in_RDI + 0xb0);
  }
  local_1c4 = local_158;
  uVar6 = (ulong)(*in_RSI & 0xffff) - ((ulong)((*in_RSI & 0xffff) >> 1) & 0x5555555555555555);
  uVar6 = (uVar6 & 0x3333333333333333) + (uVar6 >> 2 & 0x3333333333333333);
  uVar5 = (uint)(byte)((uVar6 + (uVar6 >> 4) & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  uVar4 = *in_RSI;
  local_1d1 = (byte)(uVar4 >> 0x18) & 1;
  uVar1 = *in_RSI;
  local_1d2 = (byte)(uVar1 >> 0x15) & 1;
  uVar2 = *(undefined4 *)(in_RDI + 0xb4);
  if ((*in_RSI >> 0x16 & 1) != 0) {
    *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffe0 | 0x10;
  }
  if ((*in_RSI & 0xffff) == 0) {
    if ((*in_RSI >> 0x14 & 1) == 0) {
      if ((*in_RSI >> 0x17 & 1) == 0) {
        if ((uVar4 & 0x1000000) == 0) {
          (**(code **)(in_RDI + 0x28))(local_158 - 0x3c,*(int *)(in_RDI + 0xb0) + 4,2);
        }
        else {
          (**(code **)(in_RDI + 0x28))(local_158 - 0x40,*(int *)(in_RDI + 0xb0) + 4,2);
        }
      }
      else if ((uVar4 & 0x1000000) == 0) {
        (**(code **)(in_RDI + 0x28))(local_158,*(int *)(in_RDI + 0xb0) + 4,2);
      }
      else {
        (**(code **)(in_RDI + 0x28))(local_158 + 4,*(int *)(in_RDI + 0xb0) + 4,2);
      }
    }
    else {
      (**(code **)(in_RDI + 0x10))(local_158,2);
      set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
    }
    if ((*in_RSI >> 0x17 & 1) == 0) {
      local_28c = local_158 - 0x40;
    }
    else {
      local_28c = local_158 + 0x40;
    }
    local_1c4 = local_28c;
  }
  else {
    if ((*in_RSI >> 0x17 & 1) == 0) {
      local_1d1 = (local_1d1 ^ 0xff) & 1;
      local_1cc = local_158 + uVar5 * -4;
      local_1c4 = local_1cc;
      if ((uVar1 >> 0x15 & 1) != 0) {
        uVar4 = *in_RSI >> 0x10 & 0xf;
        if (2 < gba_log_verbosity) {
          printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)local_1cc);
        }
        if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
          *(uint *)(in_RDI + 0x6c + (ulong)(uVar4 - 8) * 4) = local_1cc;
        }
        else if (uVar4 < 0xd) {
          *(uint *)(in_RDI + 0x38 + (ulong)uVar4 * 4) = local_1cc;
        }
        else if (uVar4 == 0xd) {
          switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)(in_RDI + 0x84) = local_1cc;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0x90) = local_1cc;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0x88) = local_1cc;
            break;
          default:
            *(uint *)(in_RDI + 0x80) = local_1cc;
            break;
          case 0x17:
            *(uint *)(in_RDI + 0x8c) = local_1cc;
            break;
          case 0x1b:
            *(uint *)(in_RDI + 0x94) = local_1cc;
          }
        }
        else if (uVar4 == 0xe) {
          switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            *(uint *)(in_RDI + 0x9c) = local_1cc;
            break;
          case 0x12:
            *(uint *)(in_RDI + 0xa8) = local_1cc;
            break;
          case 0x13:
            *(uint *)(in_RDI + 0xa0) = local_1cc;
            break;
          default:
            *(uint *)(in_RDI + 0x98) = local_1cc;
            break;
          case 0x17:
            *(uint *)(in_RDI + 0xa4) = local_1cc;
            break;
          case 0x1b:
            *(uint *)(in_RDI + 0xac) = local_1cc;
          }
        }
        else {
          if (uVar4 != 0xf) {
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                    ,0xeb);
            fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
            exit(1);
          }
          if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
            set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          }
          else {
            set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
          }
        }
        local_1d2 = 0;
      }
    }
    else {
      local_1cc = local_158 + uVar5 * 4;
    }
    if (local_1d1 == 0) {
      local_1d8 = 0;
      local_1dc = 4;
    }
    else {
      local_1d8 = 4;
      local_1dc = 0;
    }
    local_1e0 = 2;
    if ((*in_RSI >> 0x14 & 1) == 0) {
      bVar3 = true;
      for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
        if (((int)(*in_RSI & 0xffff) >> ((byte)local_1ec & 0x1f) & 1U) == 1) {
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Will transfer r%d\n\n",(ulong)local_1ec);
          }
          local_1c4 = local_1d8 + local_1c4;
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Transferring r%d to 0x%08X\n",(ulong)local_1ec,(ulong)local_1c4);
          }
          if (local_1ec == (*in_RSI >> 0x10 & 0xf)) {
            if (bVar3) {
              local_1f0 = local_158;
            }
            else {
              local_1f0 = local_1cc;
            }
          }
          else {
            if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < local_1ec)) &&
               (local_1ec < 0xd)) {
              local_1a8 = *(uint *)(in_RDI + 0x6c + (ulong)(local_1ec - 8) * 4);
            }
            else if (local_1ec < 0xd) {
              local_1a8 = *(uint *)(in_RDI + 0x38 + (ulong)local_1ec * 4);
            }
            else if (local_1ec == 0xd) {
              switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
              case 0x11:
                local_bc = *(uint *)(in_RDI + 0x84);
                break;
              case 0x12:
                local_bc = *(uint *)(in_RDI + 0x90);
                break;
              case 0x13:
                local_bc = *(uint *)(in_RDI + 0x88);
                break;
              default:
                local_bc = *(uint *)(in_RDI + 0x80);
                break;
              case 0x17:
                local_bc = *(uint *)(in_RDI + 0x8c);
                break;
              case 0x1b:
                local_bc = *(uint *)(in_RDI + 0x94);
              }
              local_1a8 = local_bc;
            }
            else if (local_1ec == 0xe) {
              switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
              case 0x11:
                local_60 = *(uint *)(in_RDI + 0x9c);
                break;
              case 0x12:
                local_60 = *(uint *)(in_RDI + 0xa8);
                break;
              case 0x13:
                local_60 = *(uint *)(in_RDI + 0xa0);
                break;
              default:
                local_60 = *(uint *)(in_RDI + 0x98);
                break;
              case 0x17:
                local_60 = *(uint *)(in_RDI + 0xa4);
                break;
              case 0x1b:
                local_60 = *(uint *)(in_RDI + 0xac);
              }
              local_1a8 = local_60;
            }
            else {
              if (local_1ec != 0xf) {
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                        ,0xa4);
                fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)local_1ec
                       );
                exit(1);
              }
              local_1a8 = *(uint *)(in_RDI + 0xb0);
            }
            local_1f0 = local_1a8;
            if (local_1ec == 0xf) {
              local_1f0 = local_1a8 + 4;
            }
          }
          (**(code **)(in_RDI + 0x28))(local_1c4,local_1f0,local_1e0);
          local_1e0 = 1;
          bVar3 = false;
          local_1c4 = local_1dc + local_1c4;
        }
      }
    }
    else {
      for (local_1e4 = 0; local_1e4 < 0x10; local_1e4 = local_1e4 + 1) {
        if (((int)(*in_RSI & 0xffff) >> ((byte)local_1e4 & 0x1f) & 1U) == 1) {
          if ((*in_RSI & 0xffff & 1 << ((byte)(*in_RSI >> 0x10) & 0xf)) != 0) {
            local_1d2 = 0;
          }
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Will transfer r%d\n\n",(ulong)local_1e4);
          }
          local_1c4 = local_1d8 + local_1c4;
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Transferring 0x%08X to r%d\n",(ulong)local_1c4,(ulong)local_1e4);
          }
          uVar4 = (**(code **)(in_RDI + 0x10))(local_1c4,local_1e0);
          if (2 < gba_log_verbosity) {
            printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)local_1e4,(ulong)uVar4);
          }
          if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < local_1e4)) && (local_1e4 < 0xd))
          {
            *(uint *)(in_RDI + 0x6c + (ulong)(local_1e4 - 8) * 4) = uVar4;
          }
          else if (local_1e4 < 0xd) {
            *(uint *)(in_RDI + 0x38 + (ulong)local_1e4 * 4) = uVar4;
          }
          else if (local_1e4 == 0xd) {
            switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
            case 0x11:
              *(uint *)(in_RDI + 0x84) = uVar4;
              break;
            case 0x12:
              *(uint *)(in_RDI + 0x90) = uVar4;
              break;
            case 0x13:
              *(uint *)(in_RDI + 0x88) = uVar4;
              break;
            default:
              *(uint *)(in_RDI + 0x80) = uVar4;
              break;
            case 0x17:
              *(uint *)(in_RDI + 0x8c) = uVar4;
              break;
            case 0x1b:
              *(uint *)(in_RDI + 0x94) = uVar4;
            }
          }
          else if (local_1e4 == 0xe) {
            switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
            case 0x11:
              *(uint *)(in_RDI + 0x9c) = uVar4;
              break;
            case 0x12:
              *(uint *)(in_RDI + 0xa8) = uVar4;
              break;
            case 0x13:
              *(uint *)(in_RDI + 0xa0) = uVar4;
              break;
            default:
              *(uint *)(in_RDI + 0x98) = uVar4;
              break;
            case 0x17:
              *(uint *)(in_RDI + 0xa4) = uVar4;
              break;
            case 0x1b:
              *(uint *)(in_RDI + 0xac) = uVar4;
            }
          }
          else {
            if (local_1e4 != 0xf) {
              fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                      "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                      ,0xeb);
              fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)local_1e4)
              ;
              exit(1);
            }
            if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
              set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
            }
            else {
              set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
            }
          }
          local_1e0 = 1;
          local_1c4 = local_1dc + local_1c4;
        }
      }
    }
  }
  if (local_1d2 != 0) {
    uVar4 = *in_RSI >> 0x10 & 0xf;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)local_1c4);
    }
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      *(uint *)(in_RDI + 0x6c + (ulong)(uVar4 - 8) * 4) = local_1c4;
    }
    else if (uVar4 < 0xd) {
      *(uint *)(in_RDI + 0x38 + (ulong)uVar4 * 4) = local_1c4;
    }
    else if (uVar4 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x84) = local_1c4;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x90) = local_1c4;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x88) = local_1c4;
        break;
      default:
        *(uint *)(in_RDI + 0x80) = local_1c4;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0x8c) = local_1c4;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0x94) = local_1c4;
      }
    }
    else if (uVar4 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x9c) = local_1c4;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0xa8) = local_1c4;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0xa0) = local_1c4;
        break;
      default:
        *(uint *)(in_RDI + 0x98) = local_1c4;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0xa4) = local_1c4;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0xac) = local_1c4;
      }
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
      else {
        set_pc(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
      }
    }
  }
  if ((*in_RSI >> 0x16 & 1) != 0) {
    *(uint *)(in_RDI + 0xb4) = *(uint *)(in_RDI + 0xb4) & 0xffffffe0 | (uint)((byte)uVar2 & 0x1f);
  }
  return;
}

Assistant:

void block_data_transfer(arm7tdmi_t* state, arminstr_t * arminstr) {
    block_data_transfer_t* instr = &arminstr->parsed.BLOCK_DATA_TRANSFER;
    word address = get_register(state, instr->rn);
    word base = address;
    word new_base = base;

    int num_registers = popcount(instr->rlist);

    bool p = instr->p;
    bool w = instr->w;

    byte original_mode = state->cpsr.mode;
    if (instr->s) {
        state->cpsr.mode = MODE_USER;
    }

    if (instr->rlist == 0u) {
        // Weird stuff happens when you don't specify any registers to transfer
        if (instr->l) {
            set_pc(state, state->read_word(address, ACCESS_NONSEQUENTIAL));
        } else {
            if (instr->u) {
                if (p) {
                    // 11 => STMIB
                    state->write_word(base + 4, get_register(state, REG_PC) + 4, ACCESS_NONSEQUENTIAL);
                } else {
                    // 10 => STMIA
                    state->write_word(base, get_register(state, REG_PC) + 4, ACCESS_NONSEQUENTIAL);
                }
            } else {
                if (p) {
                    // 01 => STMDB
                    state->write_word(base - 0x40, get_register(state, REG_PC) + 4, ACCESS_NONSEQUENTIAL);
                } else {
                    // 00 => STMDA
                    state->write_word(base - 0x3C, get_register(state, REG_PC) + 4, ACCESS_NONSEQUENTIAL);
                }
            }
        }
        address = instr->u ? address + 0x40 : address - 0x40;
    } else {
        if (!instr->u) {
            // When the u flag is 0, we grow down from the base register.
            // The CPU, however, still saves from the lowest numbered register first.
            // This is important when we're writing to memory-mapped io registers.
            // We simulate this behavior by setting the base to where it should _end_,
            // and growing upwards.

            // Also, since we'll be doing everything in reverse, do the writeback operation now,
            // and flip the p flag.
            p = !p;
            address -= 4 * num_registers;
            new_base = address;
            if (w) {
                set_register(state, instr->rn, address);
                w = false;
            }
        } else {
            new_base = address + 4 * num_registers;
        }

        int before_inc;
        int after_inc;
        if (p) {
            before_inc = 4;
            after_inc = 0;
        } else {
            before_inc = 0;
            after_inc = 4;
        }

        access_type_t access = ACCESS_NONSEQUENTIAL;

        if (instr->l) {
            for (unsigned int rt = 0; rt <= REG_PC; rt++) {
                if ((instr->rlist >> rt & 1) == 1) {
                    if (instr->rlist & (1 << instr->rn)) {
                        w = false; // Don't writeback to rn when we're also transferring to rn
                    }
                    logdebug("Will transfer r%d\n", rt);
                    address += before_inc;
                    logdebug("Transferring 0x%08X to r%d", address, rt)
                    set_register(state, rt, state->read_word(address, access));
                    access = ACCESS_SEQUENTIAL;
                    address += after_inc;
                }
            }
        } else {
            bool first = true;
            for (unsigned int rt = 0; rt <= REG_PC; rt++) {
                if ((instr->rlist >> rt & 1) == 1) {
                    logdebug("Will transfer r%d\n", rt);
                    address += before_inc;
                    logdebug("Transferring r%d to 0x%08X", rt, address)
                    word value;
                    if (rt == instr->rn) {
                        if (first) {
                            // Base first in rlist: write back old base.
                            value = base;
                        } else {
                            // Base NOT first in rlist: write back NEW base (address that gets written back)
                            value = new_base;
                        }
                    } else {
                        value = get_register(state, rt);
                        if (rt == REG_PC) {
                            value += 4;
                        }
                    }
                    state->write_word(address, value, access);
                    access = ACCESS_SEQUENTIAL;
                    first = false;
                    address += after_inc;
                }
            }
        }
    }

    // If we're growing down, we wrote back at the beginning, and this w will be false.
    if (w) {
        set_register(state, instr->rn, address);
    }

    if (instr->s) {
        state->cpsr.mode = original_mode;
    }
}